

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::TracingServiceImpl::AttachConsumer
          (TracingServiceImpl *this,ConsumerEndpointImpl *consumer,string *key)

{
  char *pcVar1;
  undefined8 uVar2;
  TracingSession *pTVar3;
  TracingSession *tracing_session;
  ConsumerEndpointImpl *local_30;
  string *local_28;
  string *key_local;
  ConsumerEndpointImpl *consumer_local;
  TracingServiceImpl *this_local;
  
  local_30 = consumer;
  local_28 = key;
  key_local = (string *)consumer;
  consumer_local = (ConsumerEndpointImpl *)this;
  tracing_session = (TracingSession *)::std::__cxx11::string::c_str();
  perfetto::base::ignore_result<char[36],void*,char_const*>
            ((char (*) [36])"Consumer %p attaching to session %s",&local_30,
             (char **)&tracing_session);
  if (key_local[1]._M_string_length == 0) {
    pTVar3 = GetDetachedSession(this,*(uid_t *)(key_local + 1),local_28);
    if (pTVar3 == (TracingSession *)0x0) {
      pcVar1 = perfetto::base::Basename
                         (
                         "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                         );
      uVar2 = ::std::__cxx11::string::c_str();
      perfetto::base::LogMessage
                (kLogError,pcVar1,0xdd1a,
                 "Failed to attach consumer, session \'%s\' not found for uid %d",uVar2,
                 (ulong)*(uint *)(key_local + 1));
      this_local._7_1_ = false;
    }
    else {
      key_local[1]._M_string_length = pTVar3->id;
      pTVar3->consumer_maybe_null = (ConsumerEndpointImpl *)key_local;
      ::std::__cxx11::string::clear();
      this_local._7_1_ = true;
    }
  }
  else {
    pcVar1 = perfetto::base::Basename
                       (
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
    uVar2 = ::std::__cxx11::string::c_str();
    perfetto::base::LogMessage
              (kLogError,pcVar1,0xdd12,
               "Cannot reattach consumer to session %s while it already attached tracing session ID %lu"
               ,uVar2,key_local[1]._M_string_length);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TracingServiceImpl::AttachConsumer(ConsumerEndpointImpl* consumer,
                                        const std::string& key) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  PERFETTO_DLOG("Consumer %p attaching to session %s",
                reinterpret_cast<void*>(consumer), key.c_str());
  PERFETTO_DCHECK(consumers_.count(consumer));

  if (consumer->tracing_session_id_) {
    PERFETTO_ELOG(
        "Cannot reattach consumer to session %s"
        " while it already attached tracing session ID %" PRIu64,
        key.c_str(), consumer->tracing_session_id_);
    return false;
  }

  auto* tracing_session = GetDetachedSession(consumer->uid_, key);
  if (!tracing_session) {
    PERFETTO_ELOG(
        "Failed to attach consumer, session '%s' not found for uid %d",
        key.c_str(), static_cast<int>(consumer->uid_));
    return false;
  }

  consumer->tracing_session_id_ = tracing_session->id;
  tracing_session->consumer_maybe_null = consumer;
  tracing_session->detach_key.clear();
  return true;
}